

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_color_deconverter *pjVar4;
  _func_void_j_decompress_ptr *p_Var5;
  code *pcVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = 1;
  pjVar4 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar4;
  pjVar4->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) goto LAB_00104b0a;
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) goto LAB_00104b0a;
  }
  else if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
LAB_00104b0a:
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0xb;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) goto LAB_00104b0a;
  JVar1 = cinfo->out_color_space;
  if (JVar1 == JCS_CMYK) {
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_CMYK) {
LAB_00104c02:
      pcVar6 = null_convert;
      goto LAB_00104c3b;
    }
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      pcVar6 = ycck_cmyk_convert;
LAB_00104be6:
      pjVar4->color_convert = pcVar6;
      build_ycc_rgb_table(cinfo);
      goto LAB_00104c3f;
    }
  }
  else {
    if (JVar1 == JCS_RGB) {
      cinfo->out_color_components = 3;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 == JCS_GRAYSCALE) {
        pcVar6 = gray_rgb_convert;
      }
      else {
        if (JVar1 != JCS_RGB) {
          if (JVar1 == JCS_YCbCr) {
            pcVar6 = ycc_rgb_convert;
            goto LAB_00104be6;
          }
          goto LAB_00104c0b;
        }
        pcVar6 = rgb_convert;
      }
LAB_00104c3b:
      pjVar4->color_convert = pcVar6;
      goto LAB_00104c3f;
    }
    if (JVar1 == JCS_GRAYSCALE) {
      cinfo->out_color_components = 1;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 != JCS_YCbCr) {
        if (JVar1 == JCS_RGB) {
          pjVar4->color_convert = rgb_gray_convert;
          pjVar4 = cinfo->cconvert;
          p_Var5 = (_func_void_j_decompress_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
          pjVar4[3].start_pass = p_Var5;
          pcVar6 = p_Var5 + 0x1000;
          lVar8 = 0;
          lVar10 = 0;
          for (lVar7 = 0x8000; lVar7 != 0x1daf00; lVar7 = lVar7 + 0x1d2f) {
            *(long *)(pcVar6 + -0x1000) = lVar8;
            *(long *)(pcVar6 + -0x800) = lVar10;
            *(long *)pcVar6 = lVar7;
            pcVar6 = pcVar6 + 8;
            lVar10 = lVar10 + 0x9646;
            lVar8 = lVar8 + 0x4c8b;
          }
          goto LAB_00104c3f;
        }
        if (JVar1 != JCS_GRAYSCALE) goto LAB_00104c0b;
      }
      pjVar4->color_convert = grayscale_convert;
      iVar2 = cinfo->num_components;
      lVar8 = 0x94;
      for (lVar7 = 1; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)&cinfo->comp_info->component_id + lVar8) = 0;
        lVar8 = lVar8 + 0x60;
      }
      goto LAB_00104c3f;
    }
    if (JVar1 == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      goto LAB_00104c02;
    }
  }
LAB_00104c0b:
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x1c;
  (*pjVar3->error_exit)((j_common_ptr)cinfo);
LAB_00104c3f:
  if (cinfo->quantize_colors == 0) {
    iVar9 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar9;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *) cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
	cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
	cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = ycc_rgb_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else			/* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}